

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O0

void __thiscall fizplex::LP::add_row(LP *this,Row row)

{
  ColMatrix *in_RDI;
  vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_> *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000058;
  DVector *in_stack_00000060;
  
  std::vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>::push_back
            (unaff_retaddr,(value_type *)in_RDI);
  ColMatrix::add_row(in_RDI);
  std::vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>::size
            ((vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_> *)&in_RDI[2].n);
  DVector::resize(in_stack_00000060,in_stack_00000058);
  std::vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>::size
            ((vector<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_> *)&in_RDI[2].n);
  set_b(this,in_stack_00000008);
  return;
}

Assistant:

void LP::add_row(Row row) {
  rows.push_back(row);
  A.add_row();
  b.resize(rows.size());
  set_b(rows.size() - 1);
}